

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SupplyAppearance.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::SupplyAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,SupplyAppearance *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KINT32 Value_02;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  SupplyAppearance *local_18;
  SupplyAppearance *this_local;
  
  local_18 = this;
  this_local = (SupplyAppearance *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Supply Appearance:");
  poVar1 = std::operator<<(poVar1,(anonymous_namespace)::sRetTab);
  poVar1 = std::operator<<(poVar1,"Paint Scheme:         ");
  ENUMS::GetEnumAsStringEntityPaintScheme_abi_cxx11_
            (&local_1d0,(ENUMS *)(ulong)((uint)*this & 1),Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,(anonymous_namespace)::sRetTab);
  poVar1 = std::operator<<(poVar1,"Damage:               ");
  ENUMS::GetEnumAsStringEntityDamage_abi_cxx11_
            (&local_1f0,(ENUMS *)(ulong)((uint)*this >> 3 & 3),Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,(anonymous_namespace)::sRetTab);
  poVar1 = std::operator<<(poVar1,"Parachute Status:     ");
  ENUMS::GetEnumAsStringParachute_abi_cxx11_
            (&local_210,(ENUMS *)(ulong)((uint)*this >> 7 & 3),Value_01);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,(anonymous_namespace)::sRetTab);
  poVar1 = std::operator<<(poVar1,"Flaming Effect:       ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0xf & 1);
  poVar1 = std::operator<<(poVar1,(anonymous_namespace)::sRetTab);
  poVar1 = std::operator<<(poVar1,"Frozen Status:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x15 & 1);
  poVar1 = std::operator<<(poVar1,(anonymous_namespace)::sRetTab);
  poVar1 = std::operator<<(poVar1,"State:                ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x17 & 1);
  poVar1 = std::operator<<(poVar1,(anonymous_namespace)::sRetTab);
  poVar1 = std::operator<<(poVar1,"Deployed Status:      ");
  ENUMS::GetEnumAsStringSupplyDeployed_abi_cxx11_
            (&local_230,(ENUMS *)(ulong)((byte)this->field_0x3 & 3),Value_02);
  poVar1 = std::operator<<(poVar1,(string *)&local_230);
  poVar1 = std::operator<<(poVar1,(anonymous_namespace)::sRetTab);
  poVar1 = std::operator<<(poVar1,"Masked/Cloaked:       ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x1f);
  std::operator<<(poVar1,(anonymous_namespace)::sRetTab);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString SupplyAppearance::GetAsString() const
{
    KStringStream ss;

    ss <<            "Supply Appearance:"
       << sRetTab << "Paint Scheme:         " << GetEnumAsStringEntityPaintScheme( m_PaintScheme )
       << sRetTab << "Damage:               " << GetEnumAsStringEntityDamage( m_Damage )
       << sRetTab << "Parachute Status:     " << GetEnumAsStringParachute( m_ParachuteStatus )
       << sRetTab << "Flaming Effect:       " << m_FlamingEffectField
       << sRetTab << "Frozen Status:        " << m_FrozenStatus
       << sRetTab << "State:                " << m_State
       << sRetTab << "Deployed Status:      " << GetEnumAsStringSupplyDeployed( m_DeployedStatus )
       << sRetTab << "Masked/Cloaked:       " << m_MaskedCloaked
       << sRetTab;

    return ss.str();
}